

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int rate_estimator(tran_low_t *qcoeff,int eob,TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  uint abs_level;
  int idx;
  int rate_cost;
  SCAN_ORDER *scan_order;
  int local_20;
  int local_1c;
  
  local_1c = 1;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    iVar1 = *(int *)(in_RDI + (long)av1_scan_orders[in_DL][0].scan[local_20] * 4);
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    iVar2 = get_msb(iVar1 + 1);
    local_1c = iVar2 + 1 + (uint)(iVar1 != 0) + local_1c;
  }
  return local_1c << 9;
}

Assistant:

static int rate_estimator(const tran_low_t *qcoeff, int eob, TX_SIZE tx_size) {
  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];

  assert((1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]]) >= eob);
  int rate_cost = 1;

  for (int idx = 0; idx < eob; ++idx) {
    unsigned int abs_level = abs(qcoeff[scan_order->scan[idx]]);
    rate_cost += get_msb(abs_level + 1) + 1 + (abs_level > 0);
  }

  return (rate_cost << AV1_PROB_COST_SHIFT);
}